

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O0

void __thiscall Document::append_paragraph(Document *this,Paragraph *p)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference ppPVar4;
  size_t sVar5;
  bool local_21;
  value_type local_20;
  Paragraph *last_p;
  Paragraph *p_local;
  Document *this_local;
  
  local_20 = (value_type)0x0;
  last_p = p;
  p_local = (Paragraph *)this;
  sVar3 = std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>::size(&this->_paragraph);
  if (sVar3 != 0) {
    ppPVar4 = std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>::back(&this->_paragraph);
    local_20 = *ppPVar4;
  }
  if (local_20 != (value_type)0x0) {
    iVar1 = (*last_p->_vptr_Paragraph[1])();
    iVar2 = (*local_20->_vptr_Paragraph[1])();
    if (iVar1 < iVar2) {
      local_21 = true;
      Paragraph::last(local_20,&local_21);
    }
  }
  if (last_p != (Paragraph *)0x0) {
    sVar5 = Paragraph::size(last_p);
    if (sVar5 != 0) {
      std::vector<Paragraph_*,_std::allocator<Paragraph_*>_>::push_back(&this->_paragraph,&last_p);
    }
  }
  return;
}

Assistant:

void Document::append_paragraph(Paragraph * p) {
	Paragraph *last_p(nullptr);

	if (_paragraph.size()) {
		last_p = _paragraph.back();
	}

	if (last_p and p->level() < last_p->level()) {
		last_p->last(true);
	}

	if (p and p->size()) {
		_paragraph.push_back(p);
	}
}